

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menus_settings.cpp
# Opt level: O1

void __thiscall CMenus::RenderSettingsControls(CMenus *this,CUIRect MainView)

{
  CGameClient *pCVar1;
  CUIRect CVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *pMessage;
  char *pConfirmButtonLabel;
  char *pCancelButtonLabel;
  long in_FS_OFFSET;
  float fVar6;
  vec4 ColorHot;
  CUIRect LastExpandRect;
  CUIRect Background;
  CUIRect Button;
  CUIRect BottomView;
  CUIRect local_108;
  CScrollRegionParams local_f8;
  vec2 local_80;
  CUIRect local_78;
  CUIRect local_68;
  CUIRect local_50;
  CUIRect local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = MainView;
  CUIRect::HSplitBottom(&local_40,80.0,&local_40,&local_50);
  CVar2 = local_40;
  if (((this->super_CComponent).m_pClient)->m_pClient->m_State == 3) {
    local_78.x = local_40.x;
    local_78.y = local_40.y;
    local_78.w = local_40.w;
    local_78.h = local_40.h;
    local_40 = CVar2;
  }
  else {
    CUIRect::HSplitTop(&local_40,20.0,(CUIRect *)0x0,&local_78);
  }
  pCVar1 = (this->super_CComponent).m_pClient;
  local_f8.m_ScrollbarWidth = 0.0;
  local_f8.m_ScrollbarMargin = 0.0;
  local_f8._8_8_ = (ulong)(uint)((float)pCVar1->m_pConfig->m_ClMenuAlpha / 100.0) << 0x20;
  CUIRect::Draw(&local_78,(vec4 *)&local_f8,5.0,(uint)(pCVar1->m_pClient->m_State == 0) * 3 + 0xc);
  CUIRect::HSplitTop(&local_40,20.0,(CUIRect *)0x0,&local_40);
  CUIRect::HSplitTop(&local_50,20.0,(CUIRect *)0x0,&local_50);
  if (RenderSettingsControls(CUIRect)::s_ScrollRegion == '\0') {
    iVar4 = __cxa_guard_acquire(&RenderSettingsControls(CUIRect)::s_ScrollRegion);
    if (iVar4 != 0) {
      CScrollRegion::CScrollRegion(&RenderSettingsControls::s_ScrollRegion);
      __cxa_guard_release(&RenderSettingsControls(CUIRect)::s_ScrollRegion);
    }
  }
  local_80.field_0 = (anon_union_4_2_94730284_for_vector2_base<float>_1)0x0;
  local_80.field_1 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x0;
  local_f8.m_ScrollbarWidth = 20.0;
  local_f8.m_ScrollbarMargin = 5.0;
  local_f8.m_ScrollbarBgColor.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x0;
  local_f8.m_ScrollbarBgColor.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x0;
  local_f8.m_ScrollbarBgColor.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x0;
  local_f8.m_ScrollbarBgColor.field_3 =
       (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3e800000;
  local_f8.m_RailBgColor.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
  local_f8.m_RailBgColor.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f800000;
  local_f8.m_RailBgColor.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f800000;
  local_f8.m_RailBgColor.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3e800000;
  local_f8.m_SliderColor.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f4ccccd;
  local_f8.m_SliderColor.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f4ccccd;
  local_f8.m_SliderColor.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f4ccccd;
  local_f8.m_SliderColor.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f800000;
  local_f8.m_SliderColorHover.field_0 =
       (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
  local_f8.m_SliderColorHover.field_1 =
       (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f800000;
  local_f8.m_SliderColorHover.field_2 =
       (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f800000;
  local_f8.m_SliderColorHover.field_3 =
       (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f800000;
  local_f8.m_SliderColorGrabbed._0_8_ = 0x3f6666663f666666;
  local_f8.m_SliderColorGrabbed.field_2 =
       (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f666666;
  local_f8.m_SliderColorGrabbed.field_3 =
       (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f800000;
  local_f8.m_Flags = 0;
  local_f8.m_ClipBgColor.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x0;
  local_f8.m_ClipBgColor.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x0;
  local_f8.m_ClipBgColor.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x0;
  local_f8.m_ClipBgColor.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x0;
  local_f8.m_SliderMinHeight = 25.0;
  local_f8.m_ScrollUnit = 60.0;
  CScrollRegion::Begin(&RenderSettingsControls::s_ScrollRegion,&local_40,&local_80,&local_f8);
  local_40.y = local_80.field_1.y + local_40.y;
  pcVar5 = Localize("Mouse","");
  fVar6 = DoIndependentDropdownMenu
                    (this,&RenderSettingsControls::s_MouseActive,&local_40,pcVar5,20.0,0x15e99e,
                     (bool *)0x0);
  CUIRect::HSplitTop(&local_40,fVar6 + 10.0,&local_108,&local_40);
  CScrollRegion::AddRect(&RenderSettingsControls::s_ScrollRegion,local_108);
  if (RenderSettingsControls(CUIRect)::s_JoystickActive == '\0') {
    iVar4 = __cxa_guard_acquire(&RenderSettingsControls(CUIRect)::s_JoystickActive);
    if (iVar4 != 0) {
      iVar4 = (*(((this->super_CComponent).m_pClient)->m_pInput->super_IInterface)._vptr_IInterface
                [6])();
      RenderSettingsControls::s_JoystickActive = 0 < iVar4;
      __cxa_guard_release(&RenderSettingsControls(CUIRect)::s_JoystickActive);
    }
  }
  pcVar5 = Localize("Joystick","");
  fVar6 = DoIndependentDropdownMenu
                    (this,&RenderSettingsControls::s_JoystickActive,&local_40,pcVar5,20.0,0x15ec78,
                     (bool *)0x0);
  CUIRect::HSplitTop(&local_40,fVar6 + 10.0,&local_108,&local_40);
  CScrollRegion::AddRect(&RenderSettingsControls::s_ScrollRegion,local_108);
  pcVar5 = Localize("Movement","");
  fVar6 = DoIndependentDropdownMenu
                    (this,&RenderSettingsControls::s_MovementActive,&local_40,pcVar5,20.0,0x15f892,
                     (bool *)0x0);
  CUIRect::HSplitTop(&local_40,fVar6 + 10.0,&local_108,&local_40);
  CScrollRegion::AddRect(&RenderSettingsControls::s_ScrollRegion,local_108);
  pcVar5 = Localize("Weapon","");
  fVar6 = DoIndependentDropdownMenu
                    (this,&RenderSettingsControls::s_WeaponActive,&local_40,pcVar5,20.0,0x15f950,
                     (bool *)0x0);
  CUIRect::HSplitTop(&local_40,fVar6 + 10.0,&local_108,&local_40);
  CScrollRegion::AddRect(&RenderSettingsControls::s_ScrollRegion,local_108);
  pcVar5 = Localize("Voting","");
  fVar6 = DoIndependentDropdownMenu
                    (this,&RenderSettingsControls::s_VotingActive,&local_40,pcVar5,20.0,0x15fa12,
                     (bool *)0x0);
  CUIRect::HSplitTop(&local_40,fVar6 + 10.0,&local_108,&local_40);
  CScrollRegion::AddRect(&RenderSettingsControls::s_ScrollRegion,local_108);
  pcVar5 = Localize("Chat","");
  fVar6 = DoIndependentDropdownMenu
                    (this,&RenderSettingsControls::s_ChatActive,&local_40,pcVar5,20.0,0x15fad4,
                     (bool *)0x0);
  CUIRect::HSplitTop(&local_40,fVar6 + 10.0,&local_108,&local_40);
  CScrollRegion::AddRect(&RenderSettingsControls::s_ScrollRegion,local_108);
  pcVar5 = Localize("Scoreboard","");
  fVar6 = DoIndependentDropdownMenu
                    (this,&RenderSettingsControls::s_ScoreboardActive,&local_40,pcVar5,20.0,0x15fb96
                     ,(bool *)0x0);
  CUIRect::HSplitTop(&local_40,fVar6 + 10.0,&local_108,&local_40);
  CScrollRegion::AddRect(&RenderSettingsControls::s_ScrollRegion,local_108);
  pcVar5 = Localize("Misc","");
  fVar6 = DoIndependentDropdownMenu
                    (this,&RenderSettingsControls::s_MiscActive,&local_40,pcVar5,20.0,0x15fd6e,
                     (bool *)0x0);
  CUIRect::HSplitTop(&local_40,fVar6 + 10.0,&local_108,&local_40);
  CScrollRegion::AddRect(&RenderSettingsControls::s_ScrollRegion,local_108);
  CScrollRegion::End(&RenderSettingsControls::s_ScrollRegion);
  CUIRect::VSplitRight(&local_50,local_50.w / 6.0 + -2.5,(CUIRect *)0x0,&local_50);
  RenderBackgroundShadow(this,&local_50,true,5.0);
  CUIRect::HSplitTop(&local_50,25.0,&local_50,(CUIRect *)0x0);
  local_68.x = local_50.x;
  local_68.y = local_50.y;
  if (RenderSettingsControls(CUIRect)::s_ResetButton == '\0') {
    RenderSettingsControls();
  }
  pcVar5 = Localize("Reset","");
  ColorHot.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f800000;
  ColorHot.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f400000;
  ColorHot.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
  ColorHot.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f800000;
  bVar3 = DoButton_Menu(this,&RenderSettingsControls::s_ResetButton,pcVar5,false,&local_68,
                        (char *)0x0,0xf,5.0,0.0,ColorHot,true);
  if (bVar3) {
    pcVar5 = Localize("Reset controls","");
    pMessage = Localize("Are you sure that you want to reset the controls to their defaults?","");
    pConfirmButtonLabel = Localize("Reset","");
    pCancelButtonLabel = Localize("Cancel","");
    PopupConfirm(this,pcVar5,pMessage,pConfirmButtonLabel,pCancelButtonLabel,0,0x16fda8,0,0x154962);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CMenus::RenderSettingsControls(CUIRect MainView)
{
	// cut view
	CUIRect BottomView, Button, Background;
	MainView.HSplitBottom(80.0f, &MainView, &BottomView);
	if(this->Client()->State() == IClient::STATE_ONLINE)
		Background = MainView;
	else
		MainView.HSplitTop(20.0f, 0, &Background);
	Background.Draw(vec4(0.0f, 0.0f, 0.0f, Config()->m_ClMenuAlpha/100.0f), 5.0f, Client()->State() == IClient::STATE_OFFLINE ? CUIRect::CORNER_ALL : CUIRect::CORNER_B);
	MainView.HSplitTop(20.0f, 0, &MainView);
	BottomView.HSplitTop(20.f, 0, &BottomView);

	const float HeaderHeight = 20.0f;

	static CScrollRegion s_ScrollRegion;
	vec2 ScrollOffset(0, 0);
	CScrollRegionParams ScrollParams;
	ScrollParams.m_ClipBgColor = vec4(0,0,0,0);
	ScrollParams.m_ScrollUnit = 60.0f; // inconsistent margin, 3 category header per scroll
	s_ScrollRegion.Begin(&MainView, &ScrollOffset, &ScrollParams);
	MainView.y += ScrollOffset.y;

	CUIRect LastExpandRect;
	static bool s_MouseActive = true;
	float Split = DoIndependentDropdownMenu(&s_MouseActive, &MainView, Localize("Mouse"), HeaderHeight, &CMenus::RenderSettingsControlsMouse, &s_MouseActive);

	MainView.HSplitTop(Split+10.0f, &LastExpandRect, &MainView);
	s_ScrollRegion.AddRect(LastExpandRect);
	static bool s_JoystickActive = m_pClient->Input()->NumJoysticks() > 0; // hide by default if no joystick found
	Split = DoIndependentDropdownMenu(&s_JoystickActive, &MainView, Localize("Joystick"), HeaderHeight, &CMenus::RenderSettingsControlsJoystick, &s_JoystickActive);

	MainView.HSplitTop(Split+10.0f, &LastExpandRect, &MainView);
	s_ScrollRegion.AddRect(LastExpandRect);
	static bool s_MovementActive = true;
	Split = DoIndependentDropdownMenu(&s_MovementActive, &MainView, Localize("Movement"), HeaderHeight, &CMenus::RenderSettingsControlsMovement, &s_MovementActive);

	MainView.HSplitTop(Split+10.0f, &LastExpandRect, &MainView);
	s_ScrollRegion.AddRect(LastExpandRect);
	static bool s_WeaponActive = true;
	Split = DoIndependentDropdownMenu(&s_WeaponActive, &MainView, Localize("Weapon"), HeaderHeight, &CMenus::RenderSettingsControlsWeapon, &s_WeaponActive);

	MainView.HSplitTop(Split+10.0f, &LastExpandRect, &MainView);
	s_ScrollRegion.AddRect(LastExpandRect);
	static bool s_VotingActive = true;
	Split = DoIndependentDropdownMenu(&s_VotingActive, &MainView, Localize("Voting"), HeaderHeight, &CMenus::RenderSettingsControlsVoting, &s_VotingActive);

	MainView.HSplitTop(Split+10.0f, &LastExpandRect, &MainView);
	s_ScrollRegion.AddRect(LastExpandRect);
	static bool s_ChatActive = true;
	Split = DoIndependentDropdownMenu(&s_ChatActive, &MainView, Localize("Chat"), HeaderHeight, &CMenus::RenderSettingsControlsChat, &s_ChatActive);

	MainView.HSplitTop(Split+10.0f, &LastExpandRect, &MainView);
	s_ScrollRegion.AddRect(LastExpandRect);
	static bool s_ScoreboardActive = true;
	Split = DoIndependentDropdownMenu(&s_ScoreboardActive, &MainView, Localize("Scoreboard"), HeaderHeight, &CMenus::RenderSettingsControlsScoreboard, &s_ScoreboardActive);

	MainView.HSplitTop(Split+10.0f, &LastExpandRect, &MainView);
	s_ScrollRegion.AddRect(LastExpandRect);
	static bool s_MiscActive = true;
	Split = DoIndependentDropdownMenu(&s_MiscActive, &MainView, Localize("Misc"), HeaderHeight, &CMenus::RenderSettingsControlsMisc, &s_MiscActive);

	MainView.HSplitTop(Split+10.0f, &LastExpandRect, &MainView);
	s_ScrollRegion.AddRect(LastExpandRect);

	s_ScrollRegion.End();

	// reset button
	float Spacing = 3.0f;
	float ButtonWidth = (BottomView.w/6.0f)-(Spacing*5.0)/6.0f;

	BottomView.VSplitRight(ButtonWidth, 0, &BottomView);
	RenderBackgroundShadow(&BottomView, true);

	BottomView.HSplitTop(25.0f, &BottomView, 0);
	Button = BottomView;
	static CButtonContainer s_ResetButton;
	if(DoButton_Menu(&s_ResetButton, Localize("Reset"), 0, &Button))
	{
		PopupConfirm(Localize("Reset controls"), Localize("Are you sure that you want to reset the controls to their defaults?"),
			Localize("Reset"), Localize("Cancel"), &CMenus::ResetSettingsControls);
	}
}